

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void AM_drawWalls(bool allmap)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  subsector_t *psVar7;
  int iVar8;
  uint g;
  uint uVar9;
  uint uVar10;
  AMColor *color;
  undefined7 in_register_00000039;
  long lVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  AMColor c;
  int lock;
  AMColor local_48;
  undefined4 local_40;
  int local_3c;
  ulong local_38;
  
  local_40 = (undefined4)CONCAT71(in_register_00000039,allmap);
  uVar10 = 0;
  if (am_portaloverlay.Value) {
    uVar10 = Displacements.size;
  }
  uVar9 = uVar10;
  if (-1 < (int)uVar10) {
    do {
      local_38 = (ulong)uVar9;
      uVar9 = uVar9 - 1;
      if ((uVar9 != MapPortalGroup) && (0 < numlines)) {
        lVar11 = 0;
        lVar12 = 0;
        do {
          if ((*(byte *)(*(long *)((long)lines->sidedef + lVar11) + 0xb4) & 0x40) == 0) {
            psVar7 = (subsector_t *)((long)lines->bbox + lVar11 + 0x20);
          }
          else {
            pdVar1 = *(double **)((long)lines->args + lVar11 + -0x2c);
            psVar7 = P_PointInSubsector(*(double *)((long)lines->args + lVar11 + -0x1c) * 0.5 +
                                        *pdVar1,*(double *)((long)lines->args + lVar11 + -0x14) *
                                                0.5 + pdVar1[1]);
          }
          uVar6 = psVar7->sector->PortalGroup;
          bVar13 = uVar6 == MapPortalGroup;
          if (uVar6 == uVar9) {
            dVar14 = 0.0;
            dVar15 = 0.0;
            if (uVar6 != MapPortalGroup) {
              iVar8 = MapPortalGroup * Displacements.size + uVar6;
              dVar14 = Displacements.data.Array[iVar8].pos.X;
              dVar15 = Displacements.data.Array[iVar8].pos.Y;
            }
LAB_00346984:
            pdVar1 = *(double **)((long)lines->args + lVar11 + -0x2c);
            AM_drawWalls::l.a.x = *pdVar1 + dVar14;
            AM_drawWalls::l.a.y = pdVar1[1] + dVar15;
            pdVar1 = *(double **)((long)lines->args + lVar11 + -0x24);
            AM_drawWalls::l.b.x = dVar14 + *pdVar1;
            AM_drawWalls::l.b.y = dVar15 + pdVar1[1];
            if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
              AM_rotatePoint((double *)&AM_drawWalls::l,&AM_drawWalls::l.a.y);
              AM_rotatePoint(&AM_drawWalls::l.b.x,&AM_drawWalls::l.b.y);
            }
            if ((am_cheat.Value == 0) &&
               (uVar6 = *(uint *)((long)lines->args + lVar11 + -0xc), (uVar6 >> 8 & 1) == 0)) {
              if (((char)local_40 != '\0') &&
                 ((-1 < (char)uVar6 ||
                  ((am_showallenabled == true && (bVar13 = CheckCheatmode(false), !bVar13)))))) {
                color = AMColors.c + 0x11;
LAB_00346e14:
                AM_drawMline(&AM_drawWalls::l,color);
              }
            }
            else if (((am_cheat.Value != 0 && am_cheat.Value < 4) ||
                     ((*(uint *)((long)lines->args + lVar11 + -0xc) & 0x80) == 0)) ||
                    ((am_showallenabled == true && (bVar4 = CheckCheatmode(false), !bVar4)))) {
              if (uVar10 == 0 || bVar13) {
                if ((AMColors.c[0x15].Index < 0) ||
                   ((((lVar2 = *(long *)((long)lines->bbox + lVar11 + 0x20), lVar2 == 0 ||
                      (uVar6 = *(uint *)(lVar2 + 0x1f0), (uVar6 >> 0x1e & 1) == 0)) ||
                     (((int)uVar6 < 0 || am_map_secrets.Value == 0 &&
                      ((am_map_secrets.Value != 2 ||
                       ((*(byte *)((long)lines->args + lVar11 + -0xc) & 0x20) != 0)))))) &&
                    (((lVar2 = *(long *)((long)lines->bbox + lVar11 + 0x28), lVar2 == 0 ||
                      (uVar6 = *(uint *)(lVar2 + 0x1f0), (uVar6 >> 0x1e & 1) == 0)) ||
                     (((int)uVar6 < 0 || am_map_secrets.Value == 0 &&
                      ((am_map_secrets.Value != 2 ||
                       ((*(byte *)((long)lines->args + lVar11 + -0xc) & 0x20) != 0)))))))))) {
                  if ((*(byte *)((long)lines->args + lVar11 + -0xc) & 0x20) == 0) {
                    bVar13 = AM_checkSpecialBoundary
                                       ((line_t_conflict *)((long)lines->args + lVar11 + -0x2c),
                                        AM_isTeleportSpecial,(int *)0x0,(int **)0x0);
                    if ((bVar13) && (-1 < AMColors.c[0x13].Index)) {
                      color = AMColors.c + 0x13;
                    }
                    else {
                      bVar13 = AM_checkSpecialBoundary
                                         ((line_t_conflict *)((long)lines->args + lVar11 + -0x2c),
                                          AM_isExitSpecial,(int *)0x0,(int **)0x0);
                      if ((bVar13) && (-1 < AMColors.c[0x14].Index)) {
                        color = AMColors.c + 0x14;
                      }
                      else {
                        bVar13 = AM_isLockBoundary((line_t_conflict *)
                                                   ((long)lines->args + lVar11 + -0x2c),&local_3c);
                        if (bVar13) {
                          if (AMColors.displayLocks == true) {
                            uVar6 = P_GetMapColorForLock(local_3c);
                            if ((int)uVar6 < 0) {
                              local_48 = AMColors.c[0x12];
                              color = &local_48;
                            }
                            else {
                              g = uVar6 >> 8 & 0xff;
                              local_48.RGB = ((uVar6 & 0xff) + (g << 8 | uVar6 & 0xff0000)) -
                                             0x1000000;
                              bVar5 = FColorMatcher::Pick(&ColorMatcher,uVar6 >> 0x10 & 0xff,g,
                                                          uVar6 & 0xff);
                              local_48.Index = (uint)bVar5;
                              color = &local_48;
                            }
                          }
                          else {
                            color = AMColors.c + 0x12;
                          }
                        }
                        else if (((am_showtriggerlines.Value == true) &&
                                 (-1 < AMColors.c[0xd].Index)) &&
                                (bVar13 = AM_checkSpecialBoundary
                                                    ((line_t_conflict *)
                                                     ((long)lines->args + lVar11 + -0x2c),
                                                     AM_isTriggerSpecial,(int *)0x0,(int **)0x0),
                                bVar13)) {
                          color = AMColors.c + 0xd;
                        }
                        else {
                          lVar2 = *(long *)((long)lines->bbox + lVar11 + 0x28);
                          if (lVar2 == 0) goto LAB_00346e06;
                          lVar3 = *(long *)((long)lines->bbox + lVar11 + 0x20);
                          bVar13 = true;
                          if ((*(double *)(lVar2 + 0xb0) == *(double *)(lVar3 + 0xb0)) &&
                             (!NAN(*(double *)(lVar2 + 0xb0)) && !NAN(*(double *)(lVar3 + 0xb0)))) {
                            if ((*(double *)(lVar2 + 0xb8) == *(double *)(lVar3 + 0xb8)) &&
                               (!NAN(*(double *)(lVar2 + 0xb8)) && !NAN(*(double *)(lVar3 + 0xb8))))
                            {
                              bVar13 = *(double *)(lVar3 + 0xc0) != *(double *)(lVar2 + 0xc0);
                            }
                          }
                          if (((bVar13) || (*(double *)(lVar2 + 200) != *(double *)(lVar3 + 200)))
                             || (NAN(*(double *)(lVar2 + 200)) || NAN(*(double *)(lVar3 + 200)))) {
                            color = AMColors.c + 4;
                          }
                          else {
                            bVar13 = true;
                            if ((*(double *)(lVar2 + 0xd8) == *(double *)(lVar3 + 0xd8)) &&
                               (!NAN(*(double *)(lVar2 + 0xd8)) && !NAN(*(double *)(lVar3 + 0xd8))))
                            {
                              if ((*(double *)(lVar2 + 0xe0) == *(double *)(lVar3 + 0xe0)) &&
                                 (!NAN(*(double *)(lVar2 + 0xe0)) && !NAN(*(double *)(lVar3 + 0xe0))
                                 )) {
                                bVar13 = *(double *)(lVar3 + 0xe8) != *(double *)(lVar2 + 0xe8);
                              }
                            }
                            if (((bVar13) ||
                                (*(double *)(lVar2 + 0xf0) != *(double *)(lVar3 + 0xf0))) ||
                               (NAN(*(double *)(lVar2 + 0xf0)) || NAN(*(double *)(lVar3 + 0xf0)))) {
                              color = AMColors.c + 5;
                            }
                            else {
                              bVar13 = AM_Check3DFloors((line_t_conflict *)
                                                        ((long)lines->args + lVar11 + -0x2c));
                              if (bVar13) {
                                color = AMColors.c + 6;
                              }
                              else {
                                if (2 < am_cheat.Value - 1U) goto LAB_00346e19;
                                color = AMColors.c + 3;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else if ((am_cheat.Value == 0) ||
                          (*(long *)((long)lines->bbox + lVar11 + 0x28) == 0)) {
LAB_00346e06:
                    color = AMColors.c + 2;
                  }
                  else {
                    color = AMColors.c + 0xe;
                  }
                }
                else {
                  color = AMColors.c + 0x15;
                }
              }
              else {
                color = AMColors.c + 0x16;
              }
              goto LAB_00346e14;
            }
          }
          else if ((int)local_38 == 0) {
            dVar14 = 0.0;
            if (uVar6 == MapPortalGroup) {
              dVar15 = 0.0;
            }
            else {
              dVar15 = 0.0;
              if (am_portaloverlay.Value != false) goto LAB_00346e19;
            }
            goto LAB_00346984;
          }
LAB_00346e19:
          lVar12 = lVar12 + 1;
          lVar11 = lVar11 + 0x98;
        } while (lVar12 < numlines);
      }
    } while (0 < (int)local_38);
  }
  return;
}

Assistant:

void AM_drawWalls (bool allmap)
{
	int i;
	static mline_t l;
	int lock, color;

	int numportalgroups = am_portaloverlay ? Displacements.size : 0;

	for (int p = numportalgroups - 1; p >= -1; p--)
	{
		if (p == MapPortalGroup) continue;


		for (i = 0; i < numlines; i++)
		{
			int pg;
			
			if (lines[i].sidedef[0]->Flags & WALLF_POLYOBJ)
			{
				// For polyobjects we must test the surrounding sector to get the proper group.
				pg = P_PointInSector(lines[i].v1->fX() + lines[i].Delta().X / 2, lines[i].v1->fY() + lines[i].Delta().Y / 2)->PortalGroup;
			}
			else
			{
				pg = lines[i].frontsector->PortalGroup;
			}
			DVector2 offset;
			bool portalmode = numportalgroups > 0 &&  pg != MapPortalGroup;
			if (pg == p)
			{
				offset = Displacements.getOffset(pg, MapPortalGroup);
			}
			else if (p == -1 && (pg == MapPortalGroup || !am_portaloverlay))
			{
				offset = { 0, 0 };
			}
			else continue;

			l.a.x = (lines[i].v1->fX() + offset.X);
			l.a.y = (lines[i].v1->fY() + offset.Y);
			l.b.x = (lines[i].v2->fX() + offset.X);
			l.b.y = (lines[i].v2->fY() + offset.Y);

			if (am_rotate == 1 || (am_rotate == 2 && viewactive))
			{
				AM_rotatePoint(&l.a.x, &l.a.y);
				AM_rotatePoint(&l.b.x, &l.b.y);
			}

			if (am_cheat != 0 || (lines[i].flags & ML_MAPPED))
			{
				if ((lines[i].flags & ML_DONTDRAW) && (am_cheat == 0 || am_cheat >= 4))
				{
					if (!am_showallenabled || CheckCheatmode(false))
					{
						continue;
					}
				}

				if (portalmode)
				{
					AM_drawMline(&l, AMColors.PortalColor);
				}
				else if (AM_CheckSecret(&lines[i]))
				{
					// map secret sectors like Boom
					AM_drawMline(&l, AMColors.SecretSectorColor);
				}
				else if (lines[i].flags & ML_SECRET)
				{ // secret door
					if (am_cheat != 0 && lines[i].backsector != NULL)
						AM_drawMline(&l, AMColors.SecretWallColor);
					else
						AM_drawMline(&l, AMColors.WallColor);
				}
				else if (AM_isTeleportBoundary(lines[i]) && AMColors.isValid(AMColors.IntraTeleportColor))
				{ // intra-level teleporters
					AM_drawMline(&l, AMColors.IntraTeleportColor);
				}
				else if (AM_isExitBoundary(lines[i]) && AMColors.isValid(AMColors.InterTeleportColor))
				{ // inter-level/game-ending teleporters
					AM_drawMline(&l, AMColors.InterTeleportColor);
				}
				else if (AM_isLockBoundary(lines[i], &lock))
				{
					if (AMColors.displayLocks)
					{
						color = P_GetMapColorForLock(lock);

						AMColor c;

						if (color >= 0)	c.FromRGB(RPART(color), GPART(color), BPART(color));
						else c = AMColors[AMColors.LockedColor];

						AM_drawMline(&l, c);
					}
					else
					{
						AM_drawMline(&l, AMColors.LockedColor);  // locked special
					}
				}
				else if (am_showtriggerlines
					&& AMColors.isValid(AMColors.SpecialWallColor)
					&& AM_isTriggerBoundary(lines[i]))
				{
					AM_drawMline(&l, AMColors.SpecialWallColor);	// wall with special non-door action the player can do
				}
				else if (lines[i].backsector == NULL)
				{
					AM_drawMline(&l, AMColors.WallColor);	// one-sided wall
				}
				else if (lines[i].backsector->floorplane
					!= lines[i].frontsector->floorplane)
				{
					AM_drawMline(&l, AMColors.FDWallColor); // floor level change
				}
				else if (lines[i].backsector->ceilingplane
					!= lines[i].frontsector->ceilingplane)
				{
					AM_drawMline(&l, AMColors.CDWallColor); // ceiling level change
				}
				else if (AM_Check3DFloors(&lines[i]))
				{
					AM_drawMline(&l, AMColors.EFWallColor); // Extra floor border
				}
				else if (am_cheat > 0 && am_cheat < 4)
				{
					AM_drawMline(&l, AMColors.TSWallColor);
				}
			}
			else if (allmap)
			{
				if ((lines[i].flags & ML_DONTDRAW) && (am_cheat == 0 || am_cheat >= 4))
				{
					if (!am_showallenabled || CheckCheatmode(false))
					{
						continue;
					}
				}
				AM_drawMline(&l, AMColors.NotSeenColor);
			}
		}
	}
}